

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void addArgumentToVtab(Parse *pParse)

{
  uint uVar1;
  char *__src;
  Table *pTable;
  sqlite3 *db;
  char *zArg;
  
  __src = (pParse->sArg).z;
  if ((__src != (char *)0x0) && (pTable = pParse->pNewTable, pTable != (Table *)0x0)) {
    uVar1 = (pParse->sArg).n;
    db = pParse->db;
    zArg = (char *)sqlite3DbMallocRaw(db,uVar1 + 1);
    if (zArg != (char *)0x0) {
      memcpy(zArg,__src,(long)(int)uVar1);
      zArg[(int)uVar1] = '\0';
    }
    addModuleArgument(db,pTable,zArg);
    return;
  }
  return;
}

Assistant:

static void addArgumentToVtab(Parse *pParse){
  if( pParse->sArg.z && pParse->pNewTable ){
    const char *z = (const char*)pParse->sArg.z;
    int n = pParse->sArg.n;
    sqlite3 *db = pParse->db;
    addModuleArgument(db, pParse->pNewTable, sqlite3DbStrNDup(db, z, n));
  }
}